

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_table_remove(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 aVar2;
  uint uVar3;
  uint *puVar4;
  TRef TVar5;
  MSize MVar6;
  TRef TVar7;
  RecordIndex ix;
  TValue local_78;
  double local_70;
  uint local_48;
  TRef local_44;
  undefined4 local_40;
  undefined4 local_34;
  
  puVar4 = J->base;
  uVar1 = *puVar4;
  rd->nres = 0;
  if ((uVar1 & 0x1f000000) == 0xb000000) {
    if ((*(byte *)((long)puVar4 + 7) & 0x1f) != 0) {
      recff_nyiu(J);
    }
    TVar5 = lj_ir_call(J,IRCALL_lj_tab_len,(ulong)uVar1);
    aVar2 = (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)(rd->argv->u32).lo;
    MVar6 = lj_tab_len((GCtab *)(ulong)(uint)aVar2.i);
    TVar7 = lj_ir_kint(J,0);
    (J->fold).ins.field_0.ot = (ushort)(MVar6 != 0) << 8 | 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    lj_opt_fold(J);
    if (MVar6 != 0) {
      local_78.field_2.it = 0xfffffff4;
      local_70 = (double)(int)MVar6;
      local_34 = 0;
      uVar3 = *(uint *)((long)J->L->base + -4);
      local_78._0_4_ = aVar2;
      local_48 = uVar1;
      local_44 = TVar5;
      if (((uVar3 & 3) != 0) || (*(char *)((ulong)uVar3 - 1) != '\x01')) {
        local_40 = 0;
        TVar5 = lj_record_idx(J,(RecordIndex *)&local_78.field_2);
        *J->base = TVar5;
        rd->nres = 1;
      }
      local_40 = 0x7fff;
      lj_record_idx(J,(RecordIndex *)&local_78.field_2);
    }
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_remove(jit_State *J, RecordFFData *rd)
{
  TRef tab = J->base[0];
  rd->nres = 0;
  if (tref_istab(tab)) {
    if (tref_isnil(J->base[1])) {  /* Simple pop: t[#t] = nil */
      TRef trlen = lj_ir_call(J, IRCALL_lj_tab_len, tab);
      GCtab *t = tabV(&rd->argv[0]);
      MSize len = lj_tab_len(t);
      emitir(IRTGI(len ? IR_NE : IR_EQ), trlen, lj_ir_kint(J, 0));
      if (len) {
	RecordIndex ix;
	ix.tab = tab;
	ix.key = trlen;
	settabV(J->L, &ix.tabv, t);
	setintV(&ix.keyv, len);
	ix.idxchain = 0;
	if (results_wanted(J) != 0) {  /* Specialize load only if needed. */
	  ix.val = 0;
	  J->base[0] = lj_record_idx(J, &ix);  /* Load previous value. */
	  rd->nres = 1;
	  /* Assumes ix.key/ix.tab is not modified for raw lj_record_idx(). */
	}
	ix.val = TREF_NIL;
	lj_record_idx(J, &ix);  /* Remove value. */
      }
    } else {  /* Complex case: remove in the middle. */
      recff_nyiu(J);
    }
  }  /* else: Interpreter will throw. */
}